

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pal_file.cpp
# Opt level: O2

DWORD FILEGetLastErrorFromErrno(void)

{
  DWORD *pDVar1;
  DWORD __errnum;
  
  pDVar1 = (DWORD *)__errno_location();
  __errnum = *pDVar1;
  switch(__errnum) {
  case 0:
  case 2:
    break;
  case 1:
  case 0xd:
  case 0x15:
  case 0x1e:
    __errnum = 5;
    break;
  case 3:
  case 4:
  case 6:
  case 7:
  case 8:
  case 10:
  case 0xb:
  case 0xe:
  case 0xf:
  case 0x12:
  case 0x13:
  case 0x16:
  case 0x17:
  case 0x18:
  case 0x19:
  case 0x1a:
  case 0x1b:
  case 0x1d:
  case 0x1f:
  case 0x20:
  case 0x21:
  case 0x23:
  case 0x25:
  case 0x26:
    goto switchD_001214d3_caseD_3;
  case 5:
    __errnum = 0x1d;
    break;
  case 9:
    __errnum = 6;
    break;
  case 0xc:
    __errnum = 8;
    break;
  case 0x10:
    __errnum = 0xaa;
    break;
  case 0x11:
    __errnum = 0xb7;
    break;
  case 0x14:
    __errnum = 3;
    break;
  case 0x1c:
switchD_001214d3_caseD_1c:
    __errnum = 0x70;
    break;
  case 0x22:
  case 0x28:
    __errnum = 0xa1;
    break;
  case 0x24:
    __errnum = 0xce;
    break;
  case 0x27:
    __errnum = 0x91;
    break;
  default:
    if (__errnum == 0x7a) goto switchD_001214d3_caseD_1c;
switchD_001214d3_caseD_3:
    if (PAL_InitializeChakraCoreCalled == false) goto LAB_0012154e;
    strerror(__errnum);
    __errnum = 0x1f;
  }
  if (PAL_InitializeChakraCoreCalled != false) {
    strerror(*pDVar1);
    return __errnum;
  }
LAB_0012154e:
  abort();
}

Assistant:

DWORD FILEGetLastErrorFromErrno( void )
{
    DWORD dwRet;

    switch(errno)
    {
    case 0:
        dwRet = ERROR_SUCCESS; 
        break;
    case ENAMETOOLONG:
        dwRet = ERROR_FILENAME_EXCED_RANGE;
        break;
    case ENOTDIR:
        dwRet = ERROR_PATH_NOT_FOUND; 
        break;
    case ENOENT:
        dwRet = ERROR_FILE_NOT_FOUND; 
        break;
    case EACCES:
    case EPERM:
    case EROFS:
    case EISDIR:
        dwRet = ERROR_ACCESS_DENIED; 
        break;
    case EEXIST:
        dwRet = ERROR_ALREADY_EXISTS; 
        break;
#if !defined(_AIX)
    // ENOTEMPTY is the same as EEXIST on AIX. Meaningful when involving directory operations
    case ENOTEMPTY:
        dwRet = ERROR_DIR_NOT_EMPTY; 
        break;
#endif
    case EBADF:
        dwRet = ERROR_INVALID_HANDLE; 
        break;
    case ENOMEM:
        dwRet = ERROR_NOT_ENOUGH_MEMORY; 
        break;
    case EBUSY:
        dwRet = ERROR_BUSY;
        break;
    case ENOSPC:
    case EDQUOT:
        dwRet = ERROR_DISK_FULL;
        break;
    case ELOOP:
        dwRet = ERROR_BAD_PATHNAME;
        break;
    case EIO:
        dwRet = ERROR_WRITE_FAULT;
        break;
    case ERANGE:
        dwRet = ERROR_BAD_PATHNAME;
        break;
    default:
        ERROR("unexpected errno %d (%s); returning ERROR_GEN_FAILURE\n",
              errno, strerror(errno));
        dwRet = ERROR_GEN_FAILURE;
    }

    TRACE("errno = %d (%s), LastError = %d\n", errno, strerror(errno), dwRet);

    return dwRet;
}